

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O0

UBool makeFromUTable(CnvExtData *extData,UCMTable *table)

{
  int iVar1;
  UBool UVar2;
  int32_t mapLength;
  UToolMemory *pUVar3;
  int32_t fromUCount;
  int32_t stage1Top;
  int32_t i;
  uint16_t *stage1;
  UCMTable *table_local;
  CnvExtData *extData_local;
  
  mapLength = prepareFromUMappings(table);
  pUVar3 = utm_open("cnv extension fromUTableUChars",0x10000,0x1000000,2);
  extData->fromUTableUChars = pUVar3;
  pUVar3 = utm_open("cnv extension fromUTableValues",0x10000,0x1000000,4);
  extData->fromUTableValues = pUVar3;
  pUVar3 = utm_open("cnv extension fromUBytes",0x10000,0x1000000,1);
  extData->fromUBytes = pUVar3;
  extData->stage2Top = 0x40;
  extData->stage3Top = 0x10;
  extData->stage3b[1] = 0x80000001;
  extData->stage3bTop = 2;
  utm_alloc(extData->fromUTableUChars);
  utm_alloc(extData->fromUTableValues);
  UVar2 = generateFromUTrie(extData,table,mapLength);
  if (UVar2 == '\0') {
    extData_local._7_1_ = '\0';
  }
  else {
    iVar1 = extData->stage1Top;
    for (fromUCount = 0; fromUCount < iVar1; fromUCount = fromUCount + 1) {
      extData->stage1[fromUCount] = extData->stage1[fromUCount] + (short)iVar1;
    }
    extData_local._7_1_ = '\x01';
  }
  return extData_local._7_1_;
}

Assistant:

static UBool
makeFromUTable(CnvExtData *extData, UCMTable *table) {
    uint16_t *stage1;
    int32_t i, stage1Top, fromUCount;

    fromUCount=prepareFromUMappings(table);

    extData->fromUTableUChars=utm_open("cnv extension fromUTableUChars", 0x10000, UCNV_EXT_FROM_U_DATA_MASK+1, 2);
    extData->fromUTableValues=utm_open("cnv extension fromUTableValues", 0x10000, UCNV_EXT_FROM_U_DATA_MASK+1, 4);
    extData->fromUBytes=utm_open("cnv extension fromUBytes", 0x10000, UCNV_EXT_FROM_U_DATA_MASK+1, 1);

    /* allocate all-unassigned stage blocks */
    extData->stage2Top=MBCS_STAGE_2_FIRST_ASSIGNED;
    extData->stage3Top=MBCS_STAGE_3_FIRST_ASSIGNED;

    /*
     * stage 3b stores only unique values, and in
     * index 0: 0 for "no mapping"
     * index 1: "no mapping" with preference for <subchar1> rather than <subchar>
     */
    extData->stage3b[1]=UCNV_EXT_FROM_U_SUBCHAR1;
    extData->stage3bTop=2;

    /* allocate the first entry in the fromUTable because index 0 means "no result" */
    utm_alloc(extData->fromUTableUChars);
    utm_alloc(extData->fromUTableValues);

    if(!generateFromUTrie(extData, table, fromUCount)) {
        return FALSE;
    }

    /*
     * offset the stage 1 trie entries by stage1Top because they will
     * be stored in a single array
     */
    stage1=extData->stage1;
    stage1Top=extData->stage1Top;
    for(i=0; i<stage1Top; ++i) {
        stage1[i]=(uint16_t)(stage1[i]+stage1Top);
    }

    return TRUE;
}